

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3ExprTermOffsetInit(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  int local_34;
  char *local_30;
  
  iVar1 = sqlite3Fts3EvalPhrasePoslist(*ctx,pExpr,*(int *)((long)ctx + 8),&local_30);
  iVar5 = pExpr->pPhrase->nToken;
  if (local_30 == (char *)0x0) {
    local_30 = (char *)0x0;
    local_34 = 0;
  }
  else {
    if (*local_30 < '\0') {
      uVar2 = sqlite3Fts3GetVarint32(local_30,&local_34);
      uVar3 = (ulong)uVar2;
    }
    else {
      uVar3 = 1;
      local_34 = (int)*local_30;
    }
    local_30 = local_30 + uVar3;
    local_34 = local_34 + -2;
  }
  if (0 < iVar5) {
    uVar3 = (ulong)*(int *)((long)ctx + 0xc);
    piVar4 = (int *)(*(long *)((long)ctx + 0x18) + uVar3 * 0x10 + 0xc);
    do {
      iVar5 = iVar5 + -1;
      *piVar4 = iVar5;
      *(char **)(piVar4 + -3) = local_30;
      piVar4[-1] = local_34;
      piVar4 = piVar4 + 4;
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while (iVar5 != 0);
    *(uint *)((long)ctx + 0xc) = uVar2;
  }
  return iVar1;
}

Assistant:

static int fts3ExprTermOffsetInit(Fts3Expr *pExpr, int iPhrase, void *ctx){
  TermOffsetCtx *p = (TermOffsetCtx *)ctx;
  int nTerm;                      /* Number of tokens in phrase */
  int iTerm;                      /* For looping through nTerm phrase terms */
  char *pList;                    /* Pointer to position list for phrase */
  int iPos = 0;                   /* First position in position-list */
  int rc;

  UNUSED_PARAMETER(iPhrase);
  rc = sqlite3Fts3EvalPhrasePoslist(p->pCsr, pExpr, p->iCol, &pList);
  nTerm = pExpr->pPhrase->nToken;
  if( pList ){
    fts3GetDeltaPosition(&pList, &iPos);
    assert( iPos>=0 );
  }

  for(iTerm=0; iTerm<nTerm; iTerm++){
    TermOffset *pT = &p->aTerm[p->iTerm++];
    pT->iOff = nTerm-iTerm-1;
    pT->pList = pList;
    pT->iPos = iPos;
  }

  return rc;
}